

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imapControl.cc
# Opt level: O3

int __thiscall imapControl::run(imapControl *this)

{
  short extraout_AX;
  uint uVar1;
  int iVar2;
  sendUtil *this_00;
  BufferInfoT *__n;
  void *__buf;
  int iVar3;
  uint uVar4;
  char *__format;
  FILE *__stream;
  int in_R8D;
  uint uVar5;
  char newURL [1024];
  char local_438 [1032];
  
  free((this->bufferInfo).buffer);
  (this->bufferInfo).buffer = (char *)0x0;
  (this->bufferInfo).size = 1;
  uVar1 = curl_easy_perform(this->examineMailbox);
  if (uVar1 == 0) {
    uVar1 = parseExamineRequest(this);
    if (uVar1 == 0) {
      iVar2 = this->highestmodseq;
      iVar3 = 0;
      if (iVar2 != this->oldHighestmodseq) {
        iVar3 = 0;
        memset(local_438,0,0x400);
        this->oldHighestmodseq = iVar2;
        uVar4 = this->newestUID;
        uVar5 = 5;
        if (5 < (int)uVar4) {
          uVar5 = uVar4;
        }
        if ((int)(uVar5 - 5) < (int)uVar4) {
          do {
            free((this->bufferInfo).buffer);
            (this->bufferInfo).buffer = (char *)0x0;
            (this->bufferInfo).size = 1;
            __n = (BufferInfoT *)(ulong)uVar4;
            snprintf(local_438,0x400,"imaps://imap.server.com/INBOX;UID=%d");
            uVar1 = curl_easy_setopt(this->getEmail,0x2712,local_438);
            if (uVar1 != 0) {
              __n = (BufferInfoT *)&stderr;
              fprintf(_stderr,"curl_easy_setopt returned error! Code: %d\n",(ulong)uVar1);
            }
            iVar2 = curl_easy_perform(this->getEmail);
            if (iVar2 == 0) {
LAB_001130b9:
              uVar1 = parseEmail(this);
              if (1 < (int)uVar1) {
                __format = "parsing of email found nothing to trigger a command: %d\n";
                __stream = _stdout;
                goto LAB_00113189;
              }
              if (uVar1 == 1) {
                doCommand(this);
                this_00 = (sendUtil *)operator_new(8);
                iVar3 = 0x1153a3;
                sendUtil::sendUtil(this_00,"Subject: Command executed",(this->bufferInfo).buffer);
                sendUtil::send(this_00,iVar3,__buf,(size_t)__n,in_R8D);
                sendUtil::~sendUtil(this_00);
                operator_delete(this_00,8);
                return 0;
              }
            }
            else {
              __n = &this->bufferInfo;
              run();
              if (extraout_AX != 1) {
                if (extraout_AX == 0) {
                  return 3;
                }
                goto LAB_001130b9;
              }
            }
            uVar4 = uVar4 - 1;
          } while ((int)(uVar5 - 5) < (int)uVar4);
        }
      }
    }
    else {
      fprintf(_stderr,"parsing of mailbox examination results failed: %d\n",(ulong)uVar1);
      iVar3 = 2;
    }
  }
  else {
    __format = "Mailbox examination failed: %d, skip this cycle\n";
    __stream = _stderr;
LAB_00113189:
    iVar3 = 0;
    fprintf(__stream,__format,(ulong)uVar1);
  }
  return iVar3;
}

Assistant:

int imapControl::run() {
  free(bufferInfo.buffer);
  bufferInfo.buffer = 0;
  bufferInfo.size = 1;
  int returnCode = curl_easy_perform(examineMailbox);
  if (returnCode) {
    fprintf(stderr, "Mailbox examination failed: %d, skip this cycle\n", returnCode);
    return 0;  // used to be 1, this terminated the process more often than I expected
  }
  returnCode = parseExamineRequest();
  if (returnCode) {
    fprintf(stderr, "parsing of mailbox examination results failed: %d\n", returnCode);
    return 2;
  }
  if (highestmodseq != oldHighestmodseq) {  // something has changed, see if new mail has a request
    char newURL[1024];
    memset(newURL, 0, sizeof(newURL));
    oldHighestmodseq = highestmodseq;
    int readNoMore = std::max(0, newestUID - MAX_EMAILS);  // limit how many emails are read (no more than MAX_EMAILS)
    for (int uid = newestUID; uid > readNoMore; uid--) {
      free(bufferInfo.buffer);
      bufferInfo.buffer = 0;
      bufferInfo.size = 1;
      if (!debug) {
        snprintf(newURL, sizeof(newURL), "imaps://" STR_VALUE(IMAP_URL)"/INBOX;UID=%d", uid);
        int rc = curl_easy_setopt(getEmail, CURLOPT_URL, newURL);
        if (rc) {
          fprintf(stderr, "curl_easy_setopt returned error! Code: %d\n", rc);
        }
      }
      returnCode = curl_easy_perform(getEmail);
      if (returnCode) {
        fprintf(stderr, "Mailbox read failed: %d\n", returnCode);
        if (returnCode == 78) {  // let's try one more time
          returnCode = curl_easy_perform(getEmail);
        }
        if (returnCode == 78) {  // did not find the email at this UID
          fprintf(stderr, "command was: %s\n", newURL);
          if (bufferInfo.buffer == 0) {
            fprintf(stderr, "no returned data\n");
          } else {
            fprintf(stderr, "received: %s\n", bufferInfo.buffer);
          }
          continue;  // continue with next UID
        } else {
          if (returnCode) {
            return 3;  // fail out - this was bad
          }
          fprintf(stderr, "Reread was successful\n");
        }
      }
      returnCode = parseEmail();
      if (returnCode > 1) {
        fprintf(stdout, "parsing of email found nothing to trigger a command: %d\n", returnCode);
        break;
      }
      if (returnCode == 1) {  // command found
        doCommand();
        sendUtil * sendUtilInstance = new sendUtil("Subject: Command executed", bufferInfo.buffer);
        if (debug) fprintf(stdout, "%s\n", bufferInfo.buffer);
        sendUtilInstance->send();
        delete(sendUtilInstance);
        break;
      }
    }
  }
  return 0;  // if mail reads worked, return ok
}